

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O2

bool deqp::gles3::Accuracy::isValidFloat(Precision precision,float val)

{
  bool bVar1;
  Float16 fp16;
  Float<unsigned_short,_5,_10,_15,_3U> local_a;
  
  if (precision == PRECISION_MEDIUMP) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_a,val);
    bVar1 = (local_a.m_value & 0x3ff) == 0;
    bVar1 = ((local_a.m_value & 0x7c00) != 0x7c00 || bVar1) &&
            ((local_a.m_value & 0x7fff) != 0x7c00 && ((local_a.m_value & 0x7c00) != 0 || bVar1));
  }
  else {
    bVar1 = false;
    if ((ABS(val) != INFINITY) && (((uint)val & 0x7f800000) != 0 || ((uint)val & 0x7fffff) == 0)) {
      bVar1 = ((uint)val & 0x7f800000) != 0x7f800000 || ((uint)val & 0x7fffff) == 0;
    }
  }
  return bVar1;
}

Assistant:

static bool isValidFloat (glu::Precision precision, float val)
{
	if (precision == glu::PRECISION_MEDIUMP)
	{
		tcu::Float16 fp16(val);
		return !fp16.isDenorm() && !fp16.isInf() && !fp16.isNaN();
	}
	else
	{
		tcu::Float32 fp32(val);
		return !fp32.isDenorm() && !fp32.isInf() && !fp32.isNaN();
	}
}